

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Thing_SetTranslation
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  AActor *pAVar1;
  AActor *pAVar2;
  DWORD local_54;
  DWORD local_50;
  byte local_49;
  bool ok;
  AActor *target;
  undefined1 local_38 [4];
  int range;
  TActorIterator<AActor> iterator;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  iterator.super_FActorIterator.id = arg2;
  iterator.super_FActorIterator._12_4_ = arg1;
  TActorIterator<AActor>::TActorIterator((TActorIterator<AActor> *)local_38,arg0);
  local_49 = 0;
  if ((iterator.super_FActorIterator._12_4_ == -1) && (it != (AActor *)0x0)) {
    target._4_4_ = it->Translation;
  }
  else if (((int)iterator.super_FActorIterator._12_4_ < 1) ||
          (0xfffe < (int)iterator.super_FActorIterator._12_4_)) {
    if (iterator.super_FActorIterator._12_4_ == 0x100007) {
      target._4_4_ = TRANSLATION('\x03',7);
    }
    else {
      target._4_4_ = 0;
    }
  }
  else {
    target._4_4_ = TRANSLATION('\x04',iterator.super_FActorIterator._12_4_ - 1);
  }
  if (arg0 == 0) {
    if (it != (AActor *)0x0) {
      local_49 = 1;
      if (target._4_4_ == 0) {
        pAVar1 = AActor::GetDefault(it);
        local_50 = pAVar1->Translation;
      }
      else {
        local_50 = target._4_4_;
      }
      it->Translation = local_50;
    }
  }
  else {
    while (pAVar1 = TActorIterator<AActor>::Next((TActorIterator<AActor> *)local_38),
          pAVar1 != (AActor *)0x0) {
      local_49 = 1;
      if (target._4_4_ == 0) {
        pAVar2 = AActor::GetDefault(pAVar1);
        local_54 = pAVar2->Translation;
      }
      else {
        local_54 = target._4_4_;
      }
      pAVar1->Translation = local_54;
    }
  }
  return (int)local_49;
}

Assistant:

FUNC(LS_Thing_SetTranslation)
// Thing_SetTranslation (tid, range)
{
	TActorIterator<AActor> iterator (arg0);
	int range;
	AActor *target;
	bool ok = false;

	if (arg1 == -1 && it != NULL)
	{
		range = it->Translation;
	}
	else if (arg1 >= 1 && arg1 < MAX_ACS_TRANSLATIONS)
	{
		range = TRANSLATION(TRANSLATION_LevelScripted, (arg1-1));
	}
	else if (arg1 == TRANSLATION_ICE)
	{
		range = TRANSLATION(TRANSLATION_Standard, 7);
	}
	else
	{
		range = 0;
	}

	if (arg0 == 0)
	{
		if (it != NULL)
		{
			ok = true;
			it->Translation = range==0? it->GetDefault()->Translation : range;
		}
	}
	else
	{
		while ( (target = iterator.Next ()) )
		{
			ok = true;
			target->Translation = range==0? target->GetDefault()->Translation : range;
		}
	}

	return ok;
}